

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O2

uint32_t immutable::rrb_details::size_sub_trie<char,false,6>
                   (ref<immutable::rrb_details::tree_node<char,_false>_> *node,uint32_t shift)

{
  uint32_t *puVar1;
  uint32_t uVar2;
  internal_node<char,_false> *piVar3;
  rrb_size_table<false> *prVar4;
  uint uVar5;
  ref<immutable::rrb_details::internal_node<char,_false>_> intern;
  ref<immutable::rrb_details::tree_node<char,_false>_> child;
  ref<immutable::rrb_details::internal_node<char,_false>_> local_30;
  ref<immutable::rrb_details::tree_node<char,_false>_> local_28;
  
  if (shift == 0) {
    uVar2 = node->ptr->len;
  }
  else {
    local_30.ptr = (internal_node<char,_false> *)node->ptr;
    if (local_30.ptr != (internal_node<char,_false> *)0x0) {
      (local_30.ptr)->_ref_count = (local_30.ptr)->_ref_count + 1;
    }
    piVar3 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&local_30);
    prVar4 = (piVar3->size_table).ptr;
    piVar3 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&local_30);
    if (prVar4 == (rrb_size_table<false> *)0x0) {
      uVar2 = piVar3->len;
      piVar3 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&local_30);
      uVar5 = uVar2 - 1;
      local_28.ptr = (tree_node<char,_false> *)piVar3->child[uVar5].ptr;
      if ((internal_node<char,_false> *)local_28.ptr != (internal_node<char,_false> *)0x0) {
        ((internal_node<char,_false> *)local_28.ptr)->_ref_count =
             ((internal_node<char,_false> *)local_28.ptr)->_ref_count + 1;
      }
      uVar2 = size_sub_trie<char,false,6>(&local_28,shift - 6);
      uVar2 = uVar2 + (uVar5 << ((byte)shift & 0x1f));
      ref<immutable::rrb_details::tree_node<char,_false>_>::~ref(&local_28);
    }
    else {
      prVar4 = ref<immutable::rrb_details::rrb_size_table<false>_>::operator->(&piVar3->size_table);
      puVar1 = prVar4->size;
      piVar3 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&local_30);
      uVar2 = puVar1[piVar3->len - 1];
    }
    ref<immutable::rrb_details::internal_node<char,_false>_>::~ref(&local_30);
  }
  return uVar2;
}

Assistant:

inline uint32_t size_sub_trie(const ref<tree_node<T, atomic_ref_counting>>& node, uint32_t shift)
      {
      if (shift > 0)
        {
        ref<internal_node<T, atomic_ref_counting>> intern = node;
        if (intern->size_table.ptr == nullptr)
          {
          uint32_t len = intern->len;
          uint32_t child_shift = shift - bits<N>::rrb_bits;
          // TODO: for loopify recursive calls
          /* We're not sure how many are in the last child, so look it up */
          ref<tree_node<T, atomic_ref_counting>> child = intern->child[len - 1];
          uint32_t last_size = size_sub_trie<T, atomic_ref_counting, N>(child, child_shift);
          /* We know all but the last ones are filled, and they have child_shift
             elements in them. */
          return ((len - 1) << shift) + last_size;
          }
        else
          {
          return intern->size_table->size[intern->len - 1];
          }
        }
      else
        {
        leaf_node<T, atomic_ref_counting>* leaf = (leaf_node<T, atomic_ref_counting>*)node.ptr;
        return leaf->len;
        }
      }